

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_host(Curl_easy *data,connectdata *conn)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  
  if (((data->state).field_0x74c & 2) == 0) {
    (*Curl_cfree)((data->state).first_host);
    pcVar3 = (*Curl_cstrdup)((conn->host).name);
    (data->state).first_host = pcVar3;
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).first_remote_port = conn->remote_port;
    (data->state).first_remote_protocol = conn->handler->protocol;
  }
  (*Curl_cfree)((data->state).aptr.host);
  (data->state).aptr.host = (char *)0x0;
  pcVar3 = Curl_checkheaders(data,"Host",4);
  if ((pcVar3 == (char *)0x0) ||
     ((((data->state).field_0x74c & 2) != 0 &&
      (iVar2 = curl_strequal((data->state).first_host,(conn->host).name), iVar2 == 0)))) {
    pcVar3 = (conn->host).name;
    uVar1 = conn->given->protocol;
    if ((((uVar1 & 2) == 0) || (conn->remote_port != 0x1bb)) &&
       (((uVar1 & 1) == 0 || (conn->remote_port != 0x50)))) {
      bVar7 = ((uint)conn->bits >> 0xb & 1) == 0;
      pcVar4 = "[";
      if (bVar7) {
        pcVar4 = "";
      }
      pcVar6 = "]";
      if (bVar7) {
        pcVar6 = "";
      }
      pcVar3 = curl_maprintf("Host: %s%s%s:%d\r\n",pcVar4,pcVar3,pcVar6,
                             (ulong)(uint)conn->remote_port);
    }
    else {
      bVar7 = ((uint)conn->bits >> 0xb & 1) == 0;
      pcVar4 = "[";
      if (bVar7) {
        pcVar4 = "";
      }
      pcVar6 = "]";
      if (bVar7) {
        pcVar6 = "";
      }
      pcVar3 = curl_maprintf("Host: %s%s%s\r\n",pcVar4,pcVar3,pcVar6);
    }
    (data->state).aptr.host = pcVar3;
    if (pcVar3 != (char *)0x0) {
      return CURLE_OK;
    }
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar4 = Curl_copy_header_value(pcVar3);
  if (pcVar4 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if (*pcVar4 == '[') {
    sVar5 = strlen(pcVar4);
    memmove(pcVar4,pcVar4 + 1,sVar5 - 1);
    iVar2 = 0x5d;
  }
  else {
    if (*pcVar4 == '\0') {
      (*Curl_cfree)(pcVar4);
      goto LAB_006a695b;
    }
    iVar2 = 0x3a;
  }
  pcVar6 = strchr(pcVar4,iVar2);
  if (pcVar6 != (char *)0x0) {
    *pcVar6 = '\0';
  }
  (*Curl_cfree)((data->state).aptr.cookiehost);
  (data->state).aptr.cookiehost = pcVar4;
LAB_006a695b:
  iVar2 = curl_strequal("Host:",pcVar3);
  if (iVar2 == 0) {
    pcVar3 = curl_maprintf("Host:%s\r\n",pcVar3 + 5);
    (data->state).aptr.host = pcVar3;
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_host(struct Curl_easy *data, struct connectdata *conn)
{
  const char *ptr;
  struct dynamically_allocated_data *aptr = &data->state.aptr;
  if(!data->state.this_is_a_follow) {
    /* Free to avoid leaking memory on multiple requests */
    free(data->state.first_host);

    data->state.first_host = strdup(conn->host.name);
    if(!data->state.first_host)
      return CURLE_OUT_OF_MEMORY;

    data->state.first_remote_port = conn->remote_port;
    data->state.first_remote_protocol = conn->handler->protocol;
  }
  Curl_safefree(aptr->host);

  ptr = Curl_checkheaders(data, STRCONST("Host"));
  if(ptr && (!data->state.this_is_a_follow ||
             strcasecompare(data->state.first_host, conn->host.name))) {
#if !defined(CURL_DISABLE_COOKIES)
    /* If we have a given custom Host: header, we extract the host name in
       order to possibly use it for cookie reasons later on. We only allow the
       custom Host: header if this is NOT a redirect, as setting Host: in the
       redirected request is being out on thin ice. Except if the host name
       is the same as the first one! */
    char *cookiehost = Curl_copy_header_value(ptr);
    if(!cookiehost)
      return CURLE_OUT_OF_MEMORY;
    if(!*cookiehost)
      /* ignore empty data */
      free(cookiehost);
    else {
      /* If the host begins with '[', we start searching for the port after
         the bracket has been closed */
      if(*cookiehost == '[') {
        char *closingbracket;
        /* since the 'cookiehost' is an allocated memory area that will be
           freed later we cannot simply increment the pointer */
        memmove(cookiehost, cookiehost + 1, strlen(cookiehost) - 1);
        closingbracket = strchr(cookiehost, ']');
        if(closingbracket)
          *closingbracket = 0;
      }
      else {
        int startsearch = 0;
        char *colon = strchr(cookiehost + startsearch, ':');
        if(colon)
          *colon = 0; /* The host must not include an embedded port number */
      }
      Curl_safefree(aptr->cookiehost);
      aptr->cookiehost = cookiehost;
    }
#endif

    if(!strcasecompare("Host:", ptr)) {
      aptr->host = aprintf("Host:%s\r\n", &ptr[5]);
      if(!aptr->host)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    /* When building Host: headers, we must put the host name within
       [brackets] if the host name is a plain IPv6-address. RFC2732-style. */
    const char *host = conn->host.name;

    if(((conn->given->protocol&(CURLPROTO_HTTPS|CURLPROTO_WSS)) &&
        (conn->remote_port == PORT_HTTPS)) ||
       ((conn->given->protocol&(CURLPROTO_HTTP|CURLPROTO_WS)) &&
        (conn->remote_port == PORT_HTTP)) )
      /* if(HTTPS on port 443) OR (HTTP on port 80) then don't include
         the port number in the host string */
      aptr->host = aprintf("Host: %s%s%s\r\n", conn->bits.ipv6_ip?"[":"",
                           host, conn->bits.ipv6_ip?"]":"");
    else
      aptr->host = aprintf("Host: %s%s%s:%d\r\n", conn->bits.ipv6_ip?"[":"",
                           host, conn->bits.ipv6_ip?"]":"",
                           conn->remote_port);

    if(!aptr->host)
      /* without Host: we can't make a nice request */
      return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}